

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

Result __thiscall tonk::Connection::OnControlChannel(Connection *this,uint8_t *data,uint bytes)

{
  ostringstream *poVar1;
  uchar uVar2;
  bool bVar3;
  OutputWorker *pOVar4;
  uint8_t *puVar5;
  ostream *poVar6;
  _func_int **pp_Var7;
  uint in_ECX;
  undefined4 in_register_00000014;
  uchar (*pauVar8) [8];
  Result *success;
  array<unsigned_char,_4UL> *addrPtr;
  uchar *puVar9;
  ReadByteStream controlStream;
  stringstream ss;
  ReadByteStream local_1d0;
  uchar local_1c0 [16];
  undefined1 local_1b0 [24];
  ulong local_198;
  undefined8 local_190;
  undefined4 local_188;
  uchar local_184;
  uchar uStack_183;
  uchar uStack_182;
  uchar uStack_181;
  uchar uStack_180;
  uchar uStack_17f;
  uchar uStack_17e;
  uchar uStack_17d;
  undefined8 uStack_17c;
  undefined4 local_174;
  ios_base local_130 [264];
  
  pauVar8 = (uchar (*) [8])CONCAT44(in_register_00000014,bytes);
  uVar2 = (*pauVar8)[0];
  if (in_ECX < 6 || uVar2 != 0x80) {
    if (in_ECX == 3 && uVar2 == 0x85) {
      *(undefined2 *)(data + 0xc90a) = *(undefined2 *)(*pauVar8 + 1);
      if (*(int *)(data + 0x118) < 2) {
        local_1b0._0_8_ = *(undefined8 *)(data + 0x110);
        poVar1 = (ostringstream *)(local_1b0 + 0x10);
        local_1b0._8_4_ = Debug;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,*(char **)(data + 0x148),*(long *)(data + 0x150));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Peer informed its NAT router mapped port ",0x29);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b0);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_130);
      }
    }
    else {
      puVar9 = (uchar *)pauVar8;
      if (in_ECX < 0x16 || uVar2 != 0x90) {
        if ((((in_ECX != 4 || uVar2 != 0xa0) || ((*pauVar8)[1] != 0xa0)) || ((*pauVar8)[2] != 0xa0))
           || ((*pauVar8)[3] != 0xa0)) goto LAB_0011be55;
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"Connection closed by peer (gracefully)","");
        puVar5 = (uint8_t *)operator_new(0x38);
        *(char **)puVar5 = "Disconnected";
        *(uint8_t **)(puVar5 + 8) = puVar5 + 0x18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar5 + 8),local_1b0._0_8_,
                   (char *)(local_1b0._8_8_ + local_1b0._0_8_));
        puVar5[0x28] = '\0';
        puVar5[0x29] = '\0';
        puVar5[0x2a] = '\0';
        puVar5[0x2b] = '\0';
        puVar5[0x30] = '\f';
        puVar5[0x31] = '\0';
        puVar5[0x32] = '\0';
        puVar5[0x33] = '\0';
        puVar5[0x34] = '\0';
        puVar5[0x35] = '\0';
        puVar5[0x36] = '\0';
        puVar5[0x37] = '\0';
        local_1d0.Data = puVar5;
        RefCounter::StartShutdown((RefCounter *)(data + 8),0xc,(Result *)&local_1d0);
        Result::~Result((Result *)&local_1d0);
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_);
        }
      }
      else {
        local_1d0.Data = *pauVar8 + 1;
        local_1d0.BufferBytes = in_ECX - 1;
        local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
        local_1b0[8] = '\0';
        local_1b0[9] = '\0';
        local_1b0[10] = '\0';
        local_1b0[0xb] = '\0';
        local_1b0[0xc] = '\0';
        local_1b0[0xd] = '\0';
        local_1b0[0xe] = '\0';
        local_1b0[0xf] = '\0';
        local_1b0._16_8_ = local_1b0._16_8_ & 0xffffffff00000000;
        local_198 = 0;
        local_184 = '\0';
        uStack_183 = '\0';
        uStack_182 = '\0';
        uStack_181 = '\0';
        uStack_180 = '\0';
        uStack_17f = '\0';
        uStack_17e = '\0';
        uStack_17d = '\0';
        uStack_17c = 0;
        local_174 = 0;
        local_190 = 0x200000000;
        local_188 = 0;
        local_1d0.BytesRead = 0;
        bVar3 = protocol::P2PConnectParams::Read((P2PConnectParams *)local_1b0,&local_1d0);
        if (!bVar3) {
LAB_0011be55:
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 0x10),"Server sent invalid control channel message ",
                     0x2c);
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)(local_1b0 + 0x10),(uint)(*(uchar (*) [8])puVar9)[0]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," with length ",0xd);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__cxx11::stringbuf::str();
          pp_Var7 = (_func_int **)operator_new(0x38);
          *pp_Var7 = (_func_int *)"Connection::onControlStreamMessage";
          pp_Var7[1] = (_func_int *)(pp_Var7 + 3);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(pp_Var7 + 1),local_1d0.Data,
                     local_1d0.Data + CONCAT44(local_1d0.BytesRead,local_1d0.BufferBytes));
          *(undefined4 *)(pp_Var7 + 5) = 0;
          pp_Var7[6] = (_func_int *)0x9;
          (this->super_IConnection)._vptr_IConnection = pp_Var7;
          if (local_1d0.Data != local_1c0) {
            operator_delete(local_1d0.Data);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
          std::ios_base::~ios_base(local_130);
          return (Result)(ErrorResult *)this;
        }
        onP2PStartConnect((Connection *)data,(P2PConnectParams *)local_1b0);
      }
    }
  }
  else {
    if (*(int *)(data + 0x118) < 2) {
      local_1b0._0_8_ = *(undefined8 *)(data + 0x110);
      poVar1 = (ostringstream *)(local_1b0 + 0x10);
      local_1b0._8_4_ = 1;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,*(char **)(data + 0x148),*(long *)(data + 0x150));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Remote peer set our client id and address via control channel",
                 0x3d);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b0);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_130);
    }
    puVar9 = *pauVar8 + 6;
    if (in_ECX == 0x16) {
      local_1b0._2_2_ = swap_bytes(*(undefined2 *)(*pauVar8 + 4));
      local_1b0._0_2_ = 10;
      local_1b0._4_4_ = 0;
      local_1b0._8_8_ = *(undefined8 *)puVar9;
      local_1b0._16_8_ = *(undefined8 *)(pauVar8[1] + 6);
    }
    else {
      if (in_ECX != 10) goto LAB_0011be55;
      local_1b0[8] = '\0';
      local_1b0[9] = '\0';
      local_1b0[10] = '\0';
      local_1b0[0xb] = '\0';
      local_1b0[0xc] = '\0';
      local_1b0[0xd] = '\0';
      local_1b0[0xe] = '\0';
      local_1b0[0xf] = '\0';
      local_1b0._16_8_ = 0;
      local_1b0._2_2_ = swap_bytes(*(undefined2 *)(*pauVar8 + 4));
      local_1b0._0_2_ = 2;
      local_1b0._4_4_ = *(undefined4 *)puVar9;
    }
    local_198 = local_198 & 0xffffffff00000000;
    setSelfAddress((Connection *)data,*(uint *)(*pauVar8 + 1) & 0xffffff,(UDPAddress *)local_1b0);
  }
  (this->super_IConnection)._vptr_IConnection = (_func_int **)0x0;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result Connection::OnControlChannel(const uint8_t* data, unsigned bytes)
{
    const uint8_t controlType = data[0];

    if (controlType == protocol::ControlChannel_S2C_ClientIdAndAddress &&
        bytes >= 1 + 3 + 2)
    {
        Logger.Debug("Remote peer set our client id and address via control channel");

        TONK_DEBUG_ASSERT(!ClientIdAndAddressIsSet);

        /*
            Note that it is currently safe for this event to be received
            multiple times.  If in the future we add more data then it may
            need a flag to check this being set twice.
        */
        const uint32_t id = siamese::ReadU24_LE_Min4Bytes(data + 1);
        const uint16_t port = siamese::ReadU16_LE(data + 1 + 3);

        data += 1 + 3 + 2;
        bytes -= 1 + 3 + 2;

        if (bytes == 4) // IPv4:
        {
            auto addrPtr = reinterpret_cast<const std::array<uint8_t, 4>*>(data);
            setSelfAddress(id, UDPAddress(asio::ip::address_v4(*addrPtr), port));
            return Result::Success();
        }

        if (bytes == 16) // IPv6:
        {
            auto addrPtr = reinterpret_cast<const std::array<uint8_t, 16>*>(data);
            setSelfAddress(id, UDPAddress(asio::ip::address_v6(*addrPtr), port));
            return Result::Success();
        }
    }
    else if (controlType == protocol::ControlChannel_C2S_NATExternalPort &&
        bytes == protocol::kControlNATExternalBytes)
    {
        const uint16_t port = siamese::ReadU16_LE(data + 1);

        // Peer has announced its NAT-mapped external port
        RemoteNATMapExternalPort = port;

        Logger.Debug("Peer informed its NAT router mapped port ", port);
        return Result::Success();
    }
    else if (controlType == protocol::ControlChannel_S2C_Peer2PeerConnect &&
        bytes >= 1 + protocol::P2PConnectParams::kMinBytes)
    {
        protocol::P2PConnectParams params;
        siamese::ReadByteStream controlStream(data + 1, bytes - 1);
        if (params.Read(controlStream))
        {
            onP2PStartConnect(params);
            return Result::Success();
        }
    }
    else if (controlType == protocol::ControlChannel_Disconnect &&
        bytes == protocol::kControlDisconnectBytes &&
        data[1] == protocol::ControlChannel_Disconnect &&
        data[2] == protocol::ControlChannel_Disconnect &&
        data[3] == protocol::ControlChannel_Disconnect)
    {
        SelfRefCount.StartShutdown(
            Tonk_AppRequest,
            Result("Disconnected",
                "Connection closed by peer (gracefully)",
                ErrorType::Tonk,
                Tonk_AppRequest));
        return Result::Success();
    }

    // Fall through into invalid data handler:

    TONK_DEBUG_BREAK(); // Invalid data

    std::stringstream ss;
    ss << "Server sent invalid control channel message " << (int)data[0] << " with length " << bytes;
    return Result("Connection::onControlStreamMessage", ss.str(), ErrorType::Tonk, Tonk_InvalidData);
}